

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DispatchTile
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,DispatchTileAttribs *Attribs)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  DispatchTileAttribs *Attribs_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = Attribs;
  FormatString<char[96]>
            ((string *)local_38,
             (char (*) [96])
             "Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature."
            );
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"DispatchTile",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
             ,299);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

DispatchTile(const DispatchTileAttribs& Attribs) override
    {
        UNSUPPORTED("Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature.");
    }